

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

shared_ptr<embree::Texture> __thiscall
embree::OBJLoader::loadTexture(OBJLoader *this,FileName *fname)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  key_type *in_RSI;
  element_type *in_RDI;
  shared_ptr<embree::Texture> sVar3;
  FileName *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  *in_stack_ffffffffffffff08;
  shared_ptr<embree::Texture> *in_stack_ffffffffffffff10;
  size_type *this_00;
  FileName *in_stack_ffffffffffffff70;
  FileName *in_stack_ffffffffffffff78;
  string local_78 [32];
  _Self local_58 [3];
  string local_40 [32];
  _Self local_20 [4];
  
  this_00 = &in_RSI[9]._M_string_length;
  embree::FileName::str_abi_cxx11_((FileName *)in_stack_ffffffffffffff08);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
       ::find(in_stack_ffffffffffffff08,(key_type *)0x19dc4d);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
       ::end(in_stack_ffffffffffffff08);
  bVar1 = std::operator!=(local_20,local_58);
  std::__cxx11::string::~string(local_40);
  if (bVar1) {
    embree::FileName::str_abi_cxx11_((FileName *)in_stack_ffffffffffffff08);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                  *)this_00,in_RSI);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_ffffffffffffff10,(shared_ptr<embree::Texture> *)in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_78);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    embree::FileName::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    Texture::load(in_stack_00000018);
    embree::FileName::~FileName((FileName *)0x19dd92);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<embree::Texture>)
         sVar3.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> OBJLoader::loadTexture(const FileName& fname)
  {
    if (textureMap.find(fname.str()) != textureMap.end())
      return textureMap[fname.str()];
    
    return std::shared_ptr<Texture>(Texture::load(path+fname));
  }